

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O2

string * __thiscall z80::to_string_abi_cxx11_(string *__return_storage_ptr__,z80 *this,OpCode o)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((int)this) {
  case 1:
    __s = "halt";
    __a = &local_f;
    break;
  case 2:
    __s = "ret";
    __a = &local_c;
    break;
  case 3:
    __s = "xor";
    __a = &local_9;
    break;
  case 4:
    __s = "ld";
    __a = &local_a;
    break;
  case 5:
    __s = "jp";
    __a = &local_e;
    break;
  case 6:
    __s = "call";
    __a = &local_b;
    break;
  case 7:
    __s = "ex";
    __a = &local_d;
    break;
  case 8:
    __s = "dec";
    __a = &local_10;
    break;
  case 9:
    __s = "inc";
    __a = &local_11;
    break;
  case 10:
    __s = "add";
    __a = &local_13;
    break;
  case 0xb:
    __s = "sub";
    __a = &local_14;
    break;
  case 0xc:
    __s = "cp";
    __a = &local_12;
    break;
  case 0xd:
    __s = "push";
    __a = &local_15;
    break;
  case 0xe:
    __s = "pop";
    __a = &local_16;
    break;
  default:
    __s = "unknown";
    __a = &local_17;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(const OpCode o) {
		switch (o) {
			case OpCode::_xor:
				return "xor";
			case OpCode::ld:
				return "ld";
			case OpCode::call:
				return "call";
			case OpCode::ret:
				return "ret";
			case OpCode::ex:
				return "ex";
			case OpCode::jp:
				return "jp";
			case OpCode::halt:
				return "halt";
			case OpCode::dec:
				return "dec";
			case OpCode::inc:
				return "inc";
			case OpCode::cp:
				return "cp";
			case OpCode::add:
				return "add";
			case OpCode::sub:
				return "sub";
			case OpCode::push:
				return "push";
			case OpCode::pop:
				return "pop";
			default:
				return "unknown";
		}
		return "unknown";
	}